

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O3

void __thiscall Assimp::XFileParser::CheckForSemicolon(XFileParser *this)

{
  int iVar1;
  string local_40;
  
  if (this->mIsBinaryFormat == false) {
    GetNextToken_abi_cxx11_(&local_40,this);
    iVar1 = std::__cxx11::string::compare((char *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (iVar1 != 0) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Semicolon expected.","");
      ThrowException(this,&local_40);
    }
  }
  return;
}

Assistant:

void XFileParser::CheckForSemicolon()
{
    if( mIsBinaryFormat)
        return;

    if( GetNextToken() != ";")
        ThrowException( "Semicolon expected.");
}